

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall userDefinedUnits_fileOp4_Test::TestBody(userDefinedUnits_fileOp4_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint64_t uVar3;
  precise_unit *ppVar4;
  precise_unit *ppVar5;
  char *in_R9;
  precise_unit pVar6;
  AssertHelper local_318;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_6;
  string local_2f0;
  undefined1 local_2d0 [8];
  precise_unit y4;
  Message local_2b8;
  string local_2b0;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_5;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  string local_258;
  undefined1 local_238 [8];
  precise_unit y3;
  Message local_220;
  string local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  string local_1c0;
  undefined1 local_1a0 [8];
  precise_unit y2;
  Message local_188;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  string local_128;
  undefined1 local_108 [8];
  precise_unit y1;
  precise_unit FeV;
  precise_unit HgV;
  precise_unit auV;
  precise_unit agV;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string outputstr;
  userDefinedUnits_fileOp4_Test *this_local;
  
  outputstr.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/test_unit_files/other_units4.txt"
             ,&local_51);
  units::definedUnitsFromFile((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_79 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_78,(AssertionResult *)"outputstr.empty()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x67c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  auV.base_units_ = (unit_data)0x66666666;
  auV.commodity_ = 0x40286666;
  HgV.base_units_ = (unit_data)0x66666666;
  HgV.commodity_ = 0x402c6666;
  auV.multiplier_ = 7.31315968974213e-320;
  FeV.base_units_ = (unit_data)0x33333333;
  FeV.commodity_ = 0x4031b333;
  HgV.multiplier_ = 7.31315968974213e-320;
  y1.base_units_ = (unit_data)0x33333333;
  y1.commodity_ = 0x4031b333;
  FeV.multiplier_ = 7.31315968974213e-320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,"agV",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_128,uVar3);
  y1.multiplier_ = pVar6._8_8_;
  local_108 = (undefined1  [8])pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ppVar5 = (precise_unit *)local_108;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_140,"y1","agV",ppVar5,(precise_unit *)&auV.base_units_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    ppVar5 = (precise_unit *)0x685;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x685,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  ppVar4 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_180,(units *)local_108,ppVar4,(uint64_t)ppVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_160,"to_string(y1)","\"agV\"",&local_180,(char (*) [4])"agV");
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y2.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x686,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y2.base_units_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y2.base_units_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"auV",
             (allocator *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_1c0,uVar3);
  y2.multiplier_ = pVar6._8_8_;
  local_1a0 = (undefined1  [8])pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ppVar5 = (precise_unit *)local_1a0;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1d8,"y2","auV",ppVar5,(precise_unit *)&HgV.base_units_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    ppVar5 = (precise_unit *)0x689;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x689,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  ppVar4 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_218,(units *)local_1a0,ppVar4,(uint64_t)ppVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_1f8,"to_string(y2)","\"auV\"",&local_218,(char (*) [4])"auV");
  std::__cxx11::string::~string((string *)&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y3.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y3.base_units_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y3.base_units_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"HgV",
             (allocator *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_258,uVar3);
  y3.multiplier_ = pVar6._8_8_;
  local_238 = (undefined1  [8])pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ppVar5 = (precise_unit *)local_238;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_270,"y3","HgV",ppVar5,(precise_unit *)&FeV.base_units_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    ppVar5 = (precise_unit *)0x68d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  ppVar4 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_2b0,(units *)local_238,ppVar4,(uint64_t)ppVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_290,"to_string(y3)","\"FeV\"",&local_2b0,(char (*) [4])"FeV");
  std::__cxx11::string::~string((string *)&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&y4.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x68e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&y4.base_units_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&y4.base_units_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f0,"FeV",
             (allocator *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  pVar6 = units::unit_from_string(&local_2f0,uVar3);
  y4.multiplier_ = pVar6._8_8_;
  local_2d0 = (undefined1  [8])pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_308,"y4","FeV",(precise_unit *)local_2d0,
             (precise_unit *)&y1.base_units_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x691,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  units::clearUserDefinedUnits();
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(userDefinedUnits, fileOp4)
{
    auto outputstr = definedUnitsFromFile(
        TEST_FILE_FOLDER "/test_unit_files/other_units4.txt");
    EXPECT_TRUE(outputstr.empty());

    constexpr precise_unit agV(12.2, precise::V);
    constexpr precise_unit auV(14.2, precise::V);
    constexpr precise_unit HgV(17.7, precise::V);
    constexpr precise_unit FeV(17.7, precise::V);

    auto y1 = unit_from_string("agV");

    EXPECT_EQ(y1, agV);
    EXPECT_EQ(to_string(y1), "agV");

    auto y2 = unit_from_string("auV");
    EXPECT_EQ(y2, auV);
    EXPECT_EQ(to_string(y2), "auV");

    auto y3 = unit_from_string("HgV");
    EXPECT_EQ(y3, HgV);
    EXPECT_EQ(to_string(y3), "FeV");

    auto y4 = unit_from_string("FeV");
    EXPECT_NE(y4, FeV);

    clearUserDefinedUnits();
}